

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O0

void internal_free_class(gravity_hash_t *hashtable,gravity_value_t key,gravity_value_t value,
                        void *data)

{
  int iVar1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 f_00;
  bool bVar2;
  _Bool is_super_function;
  gravity_string_t *s;
  gravity_function_t *f;
  void *data_local;
  gravity_hash_t *hashtable_local;
  gravity_value_t value_local;
  gravity_value_t key_local;
  
  f_00 = value.field_1;
  if ((value.isa == gravity_class_function) && (key.isa == gravity_class_string)) {
    if (*(gravity_exec_type *)&(f_00.p)->xdata == EXEC_TYPE_SPECIAL) {
      if ((f_00.p)->superlook != (char *)0x0) {
        gravity_function_free((gravity_vm *)0x0,(gravity_function_t *)(f_00.p)->superlook);
      }
      if ((f_00.p)->htable != (gravity_hash_t *)0x0) {
        gravity_function_free((gravity_vm *)0x0,(gravity_function_t *)(f_00.p)->htable);
      }
    }
    bVar2 = false;
    if (5 < *(uint *)((long)&(key.field_1.p)->identifier + 4)) {
      iVar1 = string_casencmp((char *)(key.field_1.p)->objclass,"$init",5);
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) {
      gravity_function_free((gravity_vm *)0x0,(gravity_function_t *)f_00.p);
    }
  }
  return;
}

Assistant:

static void internal_free_class (gravity_hash_t *hashtable, gravity_value_t key, gravity_value_t value, void *data) {
    #pragma unused (hashtable, data)

    // sanity checks
    if (!VALUE_ISA_FUNCTION(value)) return;
    if (!VALUE_ISA_STRING(key)) return;

    // check for special function
    gravity_function_t *f = VALUE_AS_FUNCTION(value);
    if (f->tag == EXEC_TYPE_SPECIAL) {
        if (f->special[0]) gravity_function_free(NULL, (gravity_function_t *)f->special[0]);
        if (f->special[1]) gravity_function_free(NULL, (gravity_function_t *)f->special[1]);
    }

    // a super special init constructor is a string that begins with $init AND it is longer than strlen($init)
    gravity_string_t *s = VALUE_AS_STRING(key);
    bool is_super_function = ((s->len > 5) && (string_casencmp(s->s, CLASS_INTERNAL_INIT_NAME, 5) == 0));
    if (!is_super_function) gravity_function_free(NULL, VALUE_AS_FUNCTION(value));
}